

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprocess.cpp
# Opt level: O2

void __thiscall QProcess::setChildProcessModifier(QProcess *this,function<void_()> *modifier)

{
  pointer __p;
  function<void_()> *this_00;
  QObjectData *pQVar1;
  
  pQVar1 = (this->super_QIODevice).super_QObject.d_ptr.d;
  this_00 = (function<void_()> *)pQVar1[8]._vptr_QObjectData;
  if (this_00 == (function<void_()> *)0x0) {
    pQVar1 = pQVar1 + 8;
    __p = (pointer)operator_new(0x40);
    *(undefined8 *)&(__p->childProcessModifier).super__Function_base._M_functor = 0;
    *(undefined8 *)((long)&(__p->childProcessModifier).super__Function_base._M_functor + 8) = 0;
    (__p->childProcessModifier).super__Function_base._M_manager = (_Manager_type)0x0;
    (__p->childProcessModifier)._M_invoker = (_Invoker_type)0x0;
    (__p->processParameters).flags = (QFlagsStorageHelper<QProcess::UnixProcessFlag,_4>)0x0;
    (__p->processParameters).lowestFileDescriptorToClose = 0;
    (__p->processParameters)._reserved[0] = 0;
    (__p->processParameters)._reserved[1] = 0;
    (__p->processParameters)._reserved[2] = 0;
    (__p->processParameters)._reserved[3] = 0;
    (__p->processParameters)._reserved[4] = 0;
    (__p->processParameters)._reserved[5] = 0;
    std::
    __uniq_ptr_impl<QProcessPrivate::UnixExtras,_std::default_delete<QProcessPrivate::UnixExtras>_>
    ::reset((__uniq_ptr_impl<QProcessPrivate::UnixExtras,_std::default_delete<QProcessPrivate::UnixExtras>_>
             *)pQVar1,__p);
    this_00 = (function<void_()> *)pQVar1->_vptr_QObjectData;
  }
  std::function<void_()>::operator=(this_00,modifier);
  return;
}

Assistant:

void QProcess::setChildProcessModifier(const std::function<void(void)> &modifier)
{
    Q_D(QProcess);
    if (!d->unixExtras)
        d->unixExtras.reset(new QProcessPrivate::UnixExtras);
    d->unixExtras->childProcessModifier = modifier;
}